

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Int8_To_Int24(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride
                  ,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  uchar *dest;
  undefined1 *puVar1;
  bool bVar2;
  
  puVar1 = (undefined1 *)((long)destinationBuffer + 2);
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    *(undefined2 *)(puVar1 + -2) = 0;
    *puVar1 = *sourceBuffer;
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride);
    puVar1 = puVar1 + destinationStride * 3;
  }
  return;
}

Assistant:

static void Int8_To_Int24(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    signed char *src = (signed char*)sourceBuffer;
    unsigned char *dest =  (unsigned char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        dest[0] = 0;
        dest[1] = 0;
        dest[2] = (*src);
#elif defined(PA_BIG_ENDIAN)
        dest[0] = (*src);
        dest[1] = 0;
        dest[2] = 0;
#endif

        src += sourceStride;
        dest += destinationStride * 3;
    }
}